

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vendor.cpp
# Opt level: O0

void __thiscall SimpleVendor::DispenseChange(SimpleVendor *this)

{
  VendorIo *pVVar1;
  uint uVar2;
  bool bVar3;
  uint local_14;
  int nickles;
  int pending;
  SimpleVendor *this_local;
  
  local_14 = Vendor::GetBalance(&this->super_Vendor);
  bVar3 = (local_14 & 1) != 0;
  if (bVar3) {
    local_14 = local_14 - 5;
  }
  pVVar1 = this->vio;
  uVar2 = Vendor::GetBalance(&this->super_Vendor);
  (*pVVar1->_vptr_VendorIo[2])
            (pVVar1,(ulong)uVar2,(long)(int)local_14 / 10 & 0xffffffff,(ulong)bVar3);
  Vendor::SetBalance(&this->super_Vendor,0);
  return;
}

Assistant:

void SimpleVendor::DispenseChange() {
    int pending = GetBalance(), nickles = 0;

    if (pending & 1) { // checks if the amount pending is odd, i.e. we need to dispense a nickle
        nickles++;
        pending -= VALUE_NICKLE;
    }

    vio->PrintChange(GetBalance(), pending / VALUE_DIME, nickles);
    SetBalance(0);
}